

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

string_t __thiscall
duckdb::QuantileSortTree::WindowScalar<duckdb::string_t,duckdb::string_t,true>
          (QuantileSortTree *this,QuantileCursor<duckdb::string_t> *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  WindowMergeSortTree *this_00;
  idx_t iVar1;
  pointer pWVar2;
  unsigned_long hidx;
  pair<unsigned_long,_unsigned_long> pVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  anon_union_16_2_67f50693_for_value aVar5;
  Interpolator<true> interp;
  ID indirect;
  Interpolator<true> local_60;
  QuantileIndirect<duckdb::string_t> local_38;
  
  this_00 = &unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
             ::operator->(&this->index_tree)->super_WindowMergeSortTree;
  WindowMergeSortTree::Build(this_00);
  local_60.desc = false;
  iVar1 = Interpolator<true>::Index(q,n);
  local_60.begin = 0;
  local_60.FRN = iVar1;
  local_60.CRN = iVar1;
  local_60.end = n;
  pWVar2 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
           operator->(&this->index_tree);
  pVar3 = WindowIndexTree::SelectNth(pWVar2,frames,iVar1);
  iVar1 = local_60.CRN;
  hidx = pVar3.first;
  if (local_60.CRN != local_60.FRN) {
    pWVar2 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
             ::operator->(&this->index_tree);
    pVar4 = WindowIndexTree::SelectNth(pWVar2,frames,iVar1);
    hidx = pVar4.first;
  }
  local_38.data = data;
  aVar5.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       Interpolator<true>::
       Interpolate<unsigned_long,duckdb::string_t,duckdb::QuantileIndirect<duckdb::string_t>>
                 (&local_60,pVar3.first,hidx,result,&local_38);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar5.pointer;
}

Assistant:

RESULT_TYPE WindowScalar(QuantileCursor<INPUT_TYPE> &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) {
		D_ASSERT(n > 0);

		//	Thread safe and idempotent.
		index_tree->Build();

		//	Find the interpolated indicies within the frame
		Interpolator<DISCRETE> interp(q, n, false);
		const auto lo_data = SelectNth(frames, interp.FRN);
		auto hi_data = lo_data;
		if (interp.CRN != interp.FRN) {
			hi_data = SelectNth(frames, interp.CRN);
		}

		//	Interpolate indirectly
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);
		return interp.template Interpolate<idx_t, RESULT_TYPE, ID>(lo_data, hi_data, result, indirect);
	}